

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

void Assimp::FindMeshCenter(aiMesh *mesh,aiVector3D *out,aiVector3D *min,aiVector3D *max)

{
  float fVar1;
  uint uVar2;
  aiVector3D *paVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  paVar3 = mesh->mVertices;
  uVar2 = mesh->mNumVertices;
  max->x = -1e+10;
  max->y = -1e+10;
  max->z = -1e+10;
  min->x = 1e+10;
  min->y = 1e+10;
  min->z = 1e+10;
  if ((ulong)uVar2 != 0) {
    lVar4 = 0;
    do {
      fVar1 = *(float *)((long)&paVar3->x + lVar4);
      fVar5 = min->x;
      if (fVar1 <= min->x) {
        fVar5 = fVar1;
      }
      fVar1 = *(float *)((long)&paVar3->y + lVar4);
      fVar6 = min->y;
      if (fVar1 <= min->y) {
        fVar6 = fVar1;
      }
      fVar1 = *(float *)((long)&paVar3->z + lVar4);
      fVar7 = min->z;
      if (fVar1 <= min->z) {
        fVar7 = fVar1;
      }
      min->x = fVar5;
      min->y = fVar6;
      min->z = fVar7;
      fVar1 = *(float *)((long)&paVar3->x + lVar4);
      fVar5 = max->x;
      if (max->x <= fVar1) {
        fVar5 = fVar1;
      }
      fVar1 = *(float *)((long)&paVar3->y + lVar4);
      fVar6 = max->y;
      if (max->y <= fVar1) {
        fVar6 = fVar1;
      }
      fVar1 = *(float *)((long)&paVar3->z + lVar4);
      fVar7 = max->z;
      if (max->z <= fVar1) {
        fVar7 = fVar1;
      }
      max->x = fVar5;
      max->y = fVar6;
      max->z = fVar7;
      lVar4 = lVar4 + 0xc;
    } while ((ulong)uVar2 * 0xc != lVar4);
  }
  fVar1 = max->y;
  fVar5 = min->y;
  fVar6 = max->z;
  fVar7 = min->z;
  out->x = (max->x - min->x) * 0.5 + min->x;
  out->y = (fVar1 - fVar5) * 0.5 + fVar5;
  out->z = (fVar6 - fVar7) * 0.5 + fVar7;
  return;
}

Assistant:

void FindMeshCenter (aiMesh* mesh, aiVector3D& out, aiVector3D& min, aiVector3D& max)
{
    ArrayBounds(mesh->mVertices,mesh->mNumVertices, min,max);
    out = min + (max-min)*(ai_real)0.5;
}